

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O1

void __thiscall Fl_Widget_Type::setimage(Fl_Widget_Type *this,Fluid_Image *i)

{
  int iVar1;
  
  if (this->image != i) {
    iVar1 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x21])();
    if (iVar1 == 0) {
      if (this->image != (Fluid_Image *)0x0) {
        Fluid_Image::decrement(this->image);
      }
      if (i == (Fluid_Image *)0x0) {
        this->image = (Fluid_Image *)0x0;
        (this->o->label_).image = (Fl_Image *)0x0;
      }
      else {
        Fluid_Image::increment(i);
        this->image = i;
        Fluid_Image::image(i,this->o);
      }
      redraw(this);
      return;
    }
  }
  return;
}

Assistant:

void Fl_Widget_Type::setimage(Fluid_Image *i) {
  if (i == image || is_window()) return;
  if (image) image->decrement();
  if (i) i->increment();
  image = i;
  if (i) i->image(o);
  else o->image(0);
  redraw();
}